

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O0

void av1_get_ref_frames(RefFrameMapPair *ref_frame_map_pairs,int cur_frame_disp,AV1_COMP *cpi,
                       int gf_index,int is_parallel_encode,int *remapped_ref_idx)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  bool bVar6;
  int i_4;
  int frame_3;
  int frame_2;
  int next_disp_order_1;
  int next_buf_max_1;
  int frame_1;
  int next_disp_order;
  int next_buf_max;
  int frame;
  int i_3;
  int altref_idx;
  int golden_idx;
  int closest_past_ref;
  int n_min_level_refs;
  int reference_frame_level;
  int frame_order;
  RefFrameMapPair ref_pair;
  int map_idx;
  int is_one_pass_rt;
  int skip_ref_unmapping;
  GF_GROUP *gf_group;
  int max_level;
  int min_level;
  int n_bufs;
  RefBufMapData buffer_map [8];
  int i_2;
  int rf_1;
  int i_1;
  int valid_rf_idx;
  int rf;
  int i;
  int buf_map_idx;
  uint local_138;
  int local_134;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_f4;
  int iStack_f0;
  int local_ec;
  int local_d4;
  int local_d0;
  int local_cc;
  RefBufMapData local_c8 [8];
  int local_44;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int *local_28;
  int local_20;
  int local_1c;
  long *local_18;
  int local_c;
  long local_8;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    in_R9[local_30] = -1;
  }
  if (((int)in_RDX[0x13acb] == 0) || (*(char *)((long)in_RDX + 0x9d661) != '\x01')) {
    local_cc = 0;
    local_28 = in_R9;
    local_20 = in_R8D;
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    memset(local_c8,0,0x80);
    local_d0 = 6;
    local_d4 = 0;
    lVar1 = *local_18;
    bVar3 = false;
    iVar4 = is_one_pass_rt_params
                      ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    for (local_ec = 0; local_ec < 8; local_ec = local_ec + 1) {
      uVar2 = *(undefined8 *)(local_8 + (long)local_ec * 8);
      iStack_f0 = (int)((ulong)uVar2 >> 0x20);
      if ((iStack_f0 != -1) && (iVar5 = is_in_ref_map(local_c8,iStack_f0,local_cc), iVar5 == 0)) {
        local_f4 = (int)uVar2;
        if (local_f4 < local_d0) {
          local_d0 = local_f4;
        }
        if (local_d4 < local_f4) {
          local_d4 = local_f4;
        }
        local_c8[local_cc].map_idx = local_ec;
        local_c8[local_cc].disp_order = iStack_f0;
        local_c8[local_cc].pyr_level = local_f4;
        local_c8[local_cc].used = 0;
        local_cc = local_cc + 1;
      }
    }
    qsort(local_c8,(long)local_cc,0x10,compare_map_idx_pair_asc);
    local_100 = 0;
    local_104 = -1;
    local_108 = -1;
    local_10c = -1;
    local_110 = local_cc;
    while (local_110 = local_110 + -1, -1 < local_110) {
      if (local_c8[local_110].pyr_level == local_d0) {
        local_100 = local_100 + 1;
        if (((local_c8[local_110].disp_order < local_c) && (local_108 == -1)) && (local_28[3] == -1)
           ) {
          local_108 = local_110;
        }
        else if (((local_c < local_c8[local_110].disp_order) && (local_10c == -1)) &&
                (local_28[6] == -1)) {
          local_10c = local_110;
        }
      }
      else if (local_c8[local_110].disp_order == local_c) {
        add_ref_to_slot(local_c8 + local_110,local_28,5);
      }
      if (((iVar4 == 0) && (*(int *)(lVar1 + 0x317c + (long)local_1c * 4) == 2)) &&
         ((*(int *)(lVar1 + 0x317c + (long)(local_1c + -1) * 4) == 1 &&
          (*(char *)(lVar1 + 400 + (long)(local_1c + -1)) == '\x06')))) {
        if (local_20 == 0) {
          bVar6 = local_c8[local_110].disp_order == *(int *)(lVar1 + 0x5698 + (long)local_1c * 4);
        }
        else {
          bVar6 = local_c8[local_110].map_idx == *(int *)((long)local_18 + 0x9d5cc);
        }
        local_138 = (uint)bVar6;
        local_c8[local_110].used = local_138;
        if (local_c8[local_110].used != 0) {
          bVar3 = true;
        }
      }
      if ((local_c8[local_110].disp_order < local_c) && (local_104 < 0)) {
        local_104 = local_110;
      }
    }
    if (local_100 <= local_cc) {
      if (-1 < local_108) {
        add_ref_to_slot(local_c8 + local_108,local_28,4);
      }
      if (-1 < local_10c) {
        add_ref_to_slot(local_c8 + local_10c,local_28,7);
      }
    }
    if (!bVar3) {
      set_unmapped_ref(local_c8,local_cc,local_100,local_d0,local_c);
    }
    for (local_114 = 1; local_114 < 4; local_114 = local_114 + 1) {
      if (local_28[local_114 + -1] == -1) {
        local_118 = 0;
        local_11c = -0x80000000;
        for (local_2c = local_cc + -1; -1 < local_2c; local_2c = local_2c + -1) {
          if (((local_c8[local_2c].used == 0) && (local_c8[local_2c].disp_order < local_c)) &&
             (local_11c < local_c8[local_2c].disp_order)) {
            local_11c = local_c8[local_2c].disp_order;
            local_118 = local_2c;
          }
        }
        local_2c = local_118;
        if ((local_118 < 0) || (local_c8[local_118].used != 0)) break;
        add_ref_to_slot(local_c8 + local_118,local_28,local_114);
      }
    }
    for (local_120 = 5; local_120 < 8; local_120 = local_120 + 1) {
      if (local_28[local_120 + -1] == -1) {
        local_124 = 0;
        local_128 = 0x7fffffff;
        for (local_2c = local_cc + -1; -1 < local_2c; local_2c = local_2c + -1) {
          if (((local_c8[local_2c].used == 0) && (local_c < local_c8[local_2c].disp_order)) &&
             (local_c8[local_2c].disp_order < local_128)) {
            local_128 = local_c8[local_2c].disp_order;
            local_124 = local_2c;
          }
        }
        local_2c = local_124;
        if ((local_124 < 0) || (local_c8[local_124].used != 0)) break;
        add_ref_to_slot(local_c8 + local_124,local_28,local_120);
      }
    }
    local_2c = local_104;
    for (iVar4 = 1; iVar4 < 8; iVar4 = iVar4 + 1) {
      if (local_28[iVar4 + -1] == -1) {
        while ((-1 < local_2c && (local_c8[local_2c].used != 0))) {
          local_2c = local_2c + -1;
        }
        if ((local_2c < 0) || (local_c8[local_2c].used != 0)) break;
        add_ref_to_slot(local_c8 + local_2c,local_28,iVar4);
      }
    }
    local_2c = local_cc + -1;
    for (iVar4 = 7; 0 < iVar4; iVar4 = iVar4 + -1) {
      if (local_28[iVar4 + -1] == -1) {
        while ((local_104 < local_2c && (local_c8[local_2c].used != 0))) {
          local_2c = local_2c + -1;
        }
        if ((local_2c < 0) || (local_c8[local_2c].used != 0)) break;
        add_ref_to_slot(local_c8 + local_2c,local_28,iVar4);
      }
    }
    for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
      if (local_28[local_134] == -1) {
        local_28[local_134] = 0;
      }
    }
  }
  else {
    for (local_34 = 1; local_34 < 8; local_34 = local_34 + 1) {
      if (*(char *)(*in_RDX + 0x21dc + (long)in_ECX * 8 + (long)local_34) != -1) {
        in_R9[local_34 + -1] = (int)*(char *)(*in_RDX + 0x21dc + (long)in_ECX * 8 + (long)local_34);
      }
    }
    local_38 = 0;
    for (local_3c = 0; local_3c < 7; local_3c = local_3c + 1) {
      if (in_R9[av1_get_ref_frames::ref_frame_type_order[local_3c] + -1] != -1) {
        local_38 = in_R9[av1_get_ref_frames::ref_frame_type_order[local_3c] + -1];
        break;
      }
    }
    for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
      if (in_R9[local_44] == -1) {
        in_R9[local_44] = local_38;
      }
    }
  }
  return;
}

Assistant:

void av1_get_ref_frames(RefFrameMapPair ref_frame_map_pairs[REF_FRAMES],
                        int cur_frame_disp, const AV1_COMP *cpi, int gf_index,
                        int is_parallel_encode,
                        int remapped_ref_idx[REF_FRAMES]) {
  int buf_map_idx = 0;

  // Initialize reference frame mappings.
  for (int i = 0; i < REF_FRAMES; ++i) remapped_ref_idx[i] = INVALID_IDX;

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    for (int rf = LAST_FRAME; rf < REF_FRAMES; ++rf) {
      if (cpi->ppi->gf_group.ref_frame_list[gf_index][rf] != INVALID_IDX) {
        remapped_ref_idx[rf - LAST_FRAME] =
            cpi->ppi->gf_group.ref_frame_list[gf_index][rf];
      }
    }

    int valid_rf_idx = 0;
    static const int ref_frame_type_order[REF_FRAMES - LAST_FRAME] = {
      GOLDEN_FRAME,  ALTREF_FRAME, LAST_FRAME, BWDREF_FRAME,
      ALTREF2_FRAME, LAST2_FRAME,  LAST3_FRAME
    };
    for (int i = 0; i < REF_FRAMES - LAST_FRAME; i++) {
      int rf = ref_frame_type_order[i];
      if (remapped_ref_idx[rf - LAST_FRAME] != INVALID_IDX) {
        valid_rf_idx = remapped_ref_idx[rf - LAST_FRAME];
        break;
      }
    }

    for (int i = 0; i < REF_FRAMES; ++i) {
      if (remapped_ref_idx[i] == INVALID_IDX) {
        remapped_ref_idx[i] = valid_rf_idx;
      }
    }

    return;
  }
#endif  // !CONFIG_REALTIME_ONLY

  RefBufMapData buffer_map[REF_FRAMES];
  int n_bufs = 0;
  memset(buffer_map, 0, REF_FRAMES * sizeof(buffer_map[0]));
  int min_level = MAX_ARF_LAYERS;
  int max_level = 0;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  int skip_ref_unmapping = 0;
  int is_one_pass_rt = is_one_pass_rt_params(cpi);

  // Go through current reference buffers and store display order, pyr level,
  // and map index.
  for (int map_idx = 0; map_idx < REF_FRAMES; map_idx++) {
    // Get reference frame buffer.
    RefFrameMapPair ref_pair = ref_frame_map_pairs[map_idx];
    if (ref_pair.disp_order == -1) continue;
    const int frame_order = ref_pair.disp_order;
    // Avoid duplicates.
    if (is_in_ref_map(buffer_map, frame_order, n_bufs)) continue;
    const int reference_frame_level = ref_pair.pyr_level;

    // Keep track of the lowest and highest levels that currently exist.
    if (reference_frame_level < min_level) min_level = reference_frame_level;
    if (reference_frame_level > max_level) max_level = reference_frame_level;

    buffer_map[n_bufs].map_idx = map_idx;
    buffer_map[n_bufs].disp_order = frame_order;
    buffer_map[n_bufs].pyr_level = reference_frame_level;
    buffer_map[n_bufs].used = 0;
    n_bufs++;
  }

  // Sort frames in ascending display order.
  qsort(buffer_map, n_bufs, sizeof(buffer_map[0]), compare_map_idx_pair_asc);

  int n_min_level_refs = 0;
  int closest_past_ref = -1;
  int golden_idx = -1;
  int altref_idx = -1;

  // Find the GOLDEN_FRAME and BWDREF_FRAME.
  // Also collect various stats about the reference frames for the remaining
  // mappings.
  for (int i = n_bufs - 1; i >= 0; i--) {
    if (buffer_map[i].pyr_level == min_level) {
      // Keep track of the number of lowest level frames.
      n_min_level_refs++;
      if (buffer_map[i].disp_order < cur_frame_disp && golden_idx == -1 &&
          remapped_ref_idx[GOLDEN_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for GOLDEN.
        golden_idx = i;
      } else if (buffer_map[i].disp_order > cur_frame_disp &&
                 altref_idx == -1 &&
                 remapped_ref_idx[ALTREF_FRAME - LAST_FRAME] == INVALID_IDX) {
        // Save index for ALTREF.
        altref_idx = i;
      }
    } else if (buffer_map[i].disp_order == cur_frame_disp) {
      // Map the BWDREF_FRAME if this is the show_existing_frame.
      add_ref_to_slot(&buffer_map[i], remapped_ref_idx, BWDREF_FRAME);
    }

    // During parallel encodes of lower layer frames, exclude the first frame
    // (frame_parallel_level 1) from being used for the reference assignment of
    // the second frame (frame_parallel_level 2).
    if (!is_one_pass_rt && gf_group->frame_parallel_level[gf_index] == 2 &&
        gf_group->frame_parallel_level[gf_index - 1] == 1 &&
        gf_group->update_type[gf_index - 1] == INTNL_ARF_UPDATE) {
      assert(gf_group->update_type[gf_index] == INTNL_ARF_UPDATE);
#if CONFIG_FPMT_TEST
      is_parallel_encode = (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_ENCODE)
                               ? is_parallel_encode
                               : 0;
#endif  // CONFIG_FPMT_TEST
      // If parallel cpis are active, use ref_idx_to_skip, else, use display
      // index.
      assert(IMPLIES(is_parallel_encode, cpi->ref_idx_to_skip != INVALID_IDX));
      assert(IMPLIES(!is_parallel_encode,
                     gf_group->skip_frame_as_ref[gf_index] != INVALID_IDX));
      buffer_map[i].used = is_parallel_encode
                               ? (buffer_map[i].map_idx == cpi->ref_idx_to_skip)
                               : (buffer_map[i].disp_order ==
                                  gf_group->skip_frame_as_ref[gf_index]);
      // In case a ref frame is excluded from being used during assignment,
      // skip the call to set_unmapped_ref(). Applicable in steady state.
      if (buffer_map[i].used) skip_ref_unmapping = 1;
    }

    // Keep track of where the frames change from being past frames to future
    // frames.
    if (buffer_map[i].disp_order < cur_frame_disp && closest_past_ref < 0)
      closest_past_ref = i;
  }

  // Do not map GOLDEN and ALTREF based on their pyramid level if all reference
  // frames have the same level.
  if (n_min_level_refs <= n_bufs) {
    // Map the GOLDEN_FRAME.
    if (golden_idx > -1)
      add_ref_to_slot(&buffer_map[golden_idx], remapped_ref_idx, GOLDEN_FRAME);
    // Map the ALTREF_FRAME.
    if (altref_idx > -1)
      add_ref_to_slot(&buffer_map[altref_idx], remapped_ref_idx, ALTREF_FRAME);
  }

  // Find the buffer to be excluded from the mapping.
  if (!skip_ref_unmapping)
    set_unmapped_ref(buffer_map, n_bufs, n_min_level_refs, min_level,
                     cur_frame_disp);

  // Place past frames in LAST_FRAME, LAST2_FRAME, and LAST3_FRAME.
  for (int frame = LAST_FRAME; frame < GOLDEN_FRAME; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in decreasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MIN;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order < cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order > next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place future frames (if there are any) in BWDREF_FRAME and ALTREF2_FRAME.
  for (int frame = BWDREF_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer
    // in increasing ouptut order relative to current picture.
    int next_buf_max = 0;
    int next_disp_order = INT_MAX;
    for (buf_map_idx = n_bufs - 1; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used &&
          buffer_map[buf_map_idx].disp_order > cur_frame_disp &&
          buffer_map[buf_map_idx].disp_order < next_disp_order) {
        next_disp_order = buffer_map[buf_map_idx].disp_order;
        next_buf_max = buf_map_idx;
      }
    }
    buf_map_idx = next_buf_max;
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining past frames.
  buf_map_idx = closest_past_ref;
  for (int frame = LAST_FRAME; frame < REF_FRAMES; frame++) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx >= 0; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Place remaining future frames.
  buf_map_idx = n_bufs - 1;
  for (int frame = ALTREF_FRAME; frame >= LAST_FRAME; frame--) {
    // Continue if the current ref slot is already full.
    if (remapped_ref_idx[frame - LAST_FRAME] != INVALID_IDX) continue;
    // Find the next unmapped reference buffer.
    for (; buf_map_idx > closest_past_ref; buf_map_idx--) {
      if (!buffer_map[buf_map_idx].used) break;
    }
    if (buf_map_idx < 0) break;
    if (buffer_map[buf_map_idx].used) break;
    add_ref_to_slot(&buffer_map[buf_map_idx], remapped_ref_idx, frame);
  }

  // Fill any slots that are empty (should only happen for the first 7 frames).
  for (int i = 0; i < REF_FRAMES; ++i)
    if (remapped_ref_idx[i] == INVALID_IDX) remapped_ref_idx[i] = 0;
}